

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_mips.cpp
# Opt level: O2

void __thiscall MipsGenerator::TranslateMULType(MipsGenerator *this,Pcode *item)

{
  PcodeType PVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  MipsGenerator *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  undefined1 auStack_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string op;
  string num3;
  string num2;
  string num1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&num1,(string *)&item->m_num1);
  std::__cxx11::string::string((string *)&num2,(string *)&item->m_num2);
  std::__cxx11::string::string((string *)&num3,(string *)&item->m_num3);
  PVar1 = item->m_op;
  op._M_dataplus._M_p = (pointer)&op.field_2;
  op._M_string_length = 0;
  op.field_2._M_local_buf[0] = '\0';
  if (PVar1 == MUL) {
    std::__cxx11::string::string((string *)auStack_1e8,"mul ",(allocator *)(auStack_1e8 + 0x20));
  }
  else {
    if (PVar1 != DIV) {
      fwrite("invalid mul type\n",0x11,1,_stderr);
      goto LAB_00151b0e;
    }
    std::__cxx11::string::string((string *)auStack_1e8,"div ",(allocator *)(auStack_1e8 + 0x20));
  }
  std::__cxx11::string::operator=((string *)&op,(string *)auStack_1e8);
  std::__cxx11::string::~string((string *)auStack_1e8);
LAB_00151b0e:
  this_00 = (MipsGenerator *)auStack_1e8;
  std::__cxx11::string::string((string *)auStack_1e8,"$25",(allocator *)(auStack_1e8 + 0x20));
  iVar2 = PrepareStoreREG(this_00,&num1,&reg1_abi_cxx11_,(string *)auStack_1e8);
  std::__cxx11::string::~string((string *)auStack_1e8);
  std::__cxx11::string::string((string *)auStack_1e8,"$26",(allocator *)(auStack_1e8 + 0x20));
  uVar3 = PrepareLoadREG(this,&num2,&reg2_abi_cxx11_,(string *)auStack_1e8);
  std::__cxx11::string::~string((string *)auStack_1e8);
  std::__cxx11::string::string((string *)auStack_1e8,"$27",(allocator *)(auStack_1e8 + 0x20));
  uVar4 = PrepareLoadREG(this,&num3,&reg3_abi_cxx11_,(string *)auStack_1e8);
  std::__cxx11::string::~string((string *)auStack_1e8);
  if ((uVar4 & uVar3) == 0xffffffff) {
    iVar5 = atoi(num2._M_dataplus._M_p);
    iVar6 = atoi(num3._M_dataplus._M_p);
    if (PVar1 == MUL) {
      iVar6 = iVar6 * iVar5;
    }
    else {
      iVar6 = iVar5 / iVar6;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (auStack_1e8 + 0x20),"li ",&reg1_abi_cxx11_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (auStack_1e8 + 0x20)," ");
    std::__cxx11::to_string(&local_1a8,iVar6);
    std::operator+(&local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1e8,
                   &local_1a8);
    Output2File(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)auStack_1e8);
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (auStack_1e8 + 0x20);
  }
  else {
    if (uVar3 == 0xffffffff) {
      std::__cxx11::string::string((string *)auStack_1e8,"$26",(allocator *)(auStack_1e8 + 0x20));
      std::__cxx11::string::operator=((string *)&reg2_abi_cxx11_,(string *)auStack_1e8);
      std::__cxx11::string::~string((string *)auStack_1e8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (auStack_1e8 + 0x20),"li ",&reg2_abi_cxx11_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_1e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (auStack_1e8 + 0x20)," ");
      std::operator+(&local_68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_1e8,&num2);
      Output2File(this,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)auStack_1e8);
      std::__cxx11::string::~string((string *)(auStack_1e8 + 0x20));
      std::operator+(&local_188,&op,&reg1_abi_cxx11_);
      std::operator+(&local_1a8,&local_188," ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (auStack_1e8 + 0x20),&local_1a8,&reg2_abi_cxx11_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_1e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (auStack_1e8 + 0x20)," ");
      std::operator+(&local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_1e8,&reg3_abi_cxx11_);
      pbVar7 = &local_88;
    }
    else if (uVar4 == 0xffffffff) {
      std::__cxx11::string::string((string *)auStack_1e8,"$27",(allocator *)(auStack_1e8 + 0x20));
      std::__cxx11::string::operator=((string *)&reg3_abi_cxx11_,(string *)auStack_1e8);
      std::__cxx11::string::~string((string *)auStack_1e8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (auStack_1e8 + 0x20),"li ",&reg3_abi_cxx11_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_1e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (auStack_1e8 + 0x20)," ");
      std::operator+(&local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_1e8,&num3);
      Output2File(this,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)auStack_1e8);
      std::__cxx11::string::~string((string *)(auStack_1e8 + 0x20));
      std::operator+(&local_188,&op,&reg1_abi_cxx11_);
      std::operator+(&local_1a8,&local_188," ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (auStack_1e8 + 0x20),&local_1a8,&reg2_abi_cxx11_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_1e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (auStack_1e8 + 0x20)," ");
      std::operator+(&local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_1e8,&reg3_abi_cxx11_);
      pbVar7 = &local_c8;
    }
    else {
      std::operator+(&local_188,&op,&reg1_abi_cxx11_);
      std::operator+(&local_1a8,&local_188," ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (auStack_1e8 + 0x20),&local_1a8,&reg2_abi_cxx11_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_1e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (auStack_1e8 + 0x20)," ");
      std::operator+(&local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_1e8,&reg3_abi_cxx11_);
      pbVar7 = &local_e8;
    }
    Output2File(this,pbVar7);
    std::__cxx11::string::~string((string *)pbVar7);
    std::__cxx11::string::~string((string *)auStack_1e8);
    std::__cxx11::string::~string((string *)(auStack_1e8 + 0x20));
    std::__cxx11::string::~string((string *)&local_1a8);
    pbVar7 = &local_188;
  }
  std::__cxx11::string::~string((string *)pbVar7);
  if (iVar2 == 1) {
    std::__cxx11::string::string((string *)auStack_1e8,"",(allocator *)&local_1a8);
    std::__cxx11::string::string((string *)(auStack_1e8 + 0x20),"t",(allocator *)&local_188);
    GenerateStore(this,&reg1_abi_cxx11_,&num1,(string *)auStack_1e8,(string *)(auStack_1e8 + 0x20));
    std::__cxx11::string::~string((string *)(auStack_1e8 + 0x20));
    std::__cxx11::string::~string((string *)auStack_1e8);
  }
  std::__cxx11::string::~string((string *)&op);
  std::__cxx11::string::~string((string *)&num3);
  std::__cxx11::string::~string((string *)&num2);
  std::__cxx11::string::~string((string *)&num1);
  return;
}

Assistant:

void MipsGenerator::TranslateMULType(Pcode& item) {
    string num1 = item.GetNum1();
    string num2 = item.GetNum2();
    string num3 = item.GetNum3();
    PcodeType op_type = item.GetOP();
    string op;
    if (op_type == MUL)
        op = string("mul ");
    else if (op_type == DIV)
        op = string("div ");
    else
        fprintf(stderr, "invalid mul type\n");
    int ret1 = PrepareStoreREG(num1, reg1, NUM1);
    int ret2 = PrepareLoadREG(num2, reg2, NUM2);
    int ret3 = PrepareLoadREG(num3, reg3, NUM3);
    if (ret2 == -1 && ret3 == -1) {
        int value;
        if (op_type == MUL)
            value = atoi(num2.c_str()) * atoi(num3.c_str());
        else
            value = atoi(num2.c_str()) / atoi(num3.c_str());
        Output2File("li " + reg1 + " " + std::to_string(value));
    } else if (ret2 == -1) {
        reg2 = NUM2;
        Output2File("li " + reg2 + " " + num2);
        Output2File(op + reg1 + " " + reg2 + " " + reg3);
    } else if (ret3 == -1) {
        reg3 = NUM3;
        Output2File("li " + reg3 + " " + num3);
        Output2File(op + reg1 + " " + reg2 + " " + reg3);
    } else {
        Output2File(op + reg1 + " " + reg2 + " " + reg3);
    }
    if (ret1 == 1) {
        GenerateStore(reg1, num1, "", TMP);
    }
}